

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O2

void __thiscall CDevice::Poke(CDevice *this,aint z80adr,byte value)

{
  int num;
  CDevicePage *pCVar1;
  
  num = GetPageOfA16(this,z80adr);
  if (num != -1) {
    pCVar1 = GetPage(this,num);
    pCVar1->RAM[(long)z80adr & (long)pCVar1->Size - 1U] = value;
  }
  return;
}

Assistant:

void CDevice::Poke(aint z80adr, byte value) {
	// write byte into device memory with current page-mapping
	const int adrPage = GetPageOfA16(z80adr);
	if (-1 == adrPage) return;		// silently ignore invalid address
	CDevicePage* page = GetPage(adrPage);
	page->RAM[z80adr & (page->Size-1)] = value;
}